

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

Cookie * Curl_cookie_add(SessionHandle *data,CookieInfo *c,_Bool httpheader,char *lineptr,
                        char *domain,char *path)

{
  char cVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  time_t tVar6;
  Cookie *pCVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  long lVar13;
  time_t tVar14;
  Cookie *pCVar15;
  Cookie *pCVar16;
  Cookie *pCVar17;
  uint uVar18;
  char *pcVar19;
  bool bVar20;
  byte bVar21;
  char *local_470;
  in_addr addr;
  char name [1024];
  
  bVar21 = 0;
  tVar6 = time((time_t *)0x0);
  pCVar7 = (Cookie *)(*Curl_ccalloc)(1,0x60);
  if (pCVar7 == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (httpheader) {
    pcVar8 = (char *)(*Curl_cmalloc)(5000);
    if (pcVar8 == (char *)0x0) {
LAB_0046da31:
      (*Curl_cfree)(pCVar7);
      return (Cookie *)0x0;
    }
    pcVar9 = strchr(lineptr,0x3b);
    for (; (*lineptr == '\t' || (*lineptr == ' ')); lineptr = lineptr + 1) {
    }
    local_470 = domain;
    bVar20 = false;
LAB_0046da53:
    *pcVar8 = '\0';
    name._0_8_ = name._0_8_ & 0xffffffffffffff00;
    iVar4 = __isoc99_sscanf(lineptr,"%1023[^;\r\n =]=%4999[^;\r\n]",name,pcVar8);
    if (iVar4 < 1) {
LAB_0046dcef:
      bVar2 = bVar20;
      if ((pcVar9 == (char *)0x0) || (lineptr = pcVar9, *pcVar9 == '\0')) goto LAB_0046de28;
      do {
        do {
          lineptr = lineptr + 1;
          cVar1 = *lineptr;
        } while (cVar1 == ' ');
      } while (cVar1 == '\t');
      pcVar9 = strchr(lineptr,0x3b);
      bVar20 = bVar2;
      if (pcVar9 == (char *)0x0) {
        if (cVar1 == '\0') goto LAB_0046de28;
        sVar10 = strlen(lineptr);
        pcVar9 = lineptr + sVar10;
      }
      goto LAB_0046da53;
    }
    sVar10 = strlen(pcVar8);
    sVar11 = strlen(name);
    for (pcVar19 = lineptr + sVar11; (cVar1 = *pcVar19, cVar1 == ' ' || (cVar1 == '\t'));
        pcVar19 = pcVar19 + 1) {
    }
    bVar2 = true;
    for (; pcVar19 = pcVar8, sVar10 != 0; sVar10 = sVar10 - 1) {
      if ((pcVar8[sVar10 - 1] != ' ') && (pcVar8[sVar10 - 1] != '\t')) {
        bVar2 = false;
        break;
      }
      pcVar8[sVar10 - 1] = '\0';
    }
    for (; (*pcVar19 == ' ' || (*pcVar19 == '\t')); pcVar19 = pcVar19 + 1) {
    }
    if (bVar2) {
      iVar4 = Curl_raw_equal("secure",name);
      if (iVar4 == 0) {
        iVar4 = Curl_raw_equal("httponly",name);
        if (iVar4 == 0) {
          if (cVar1 == '=') goto LAB_0046db41;
        }
        else {
          pCVar7->httponly = true;
        }
      }
      else {
        pCVar7->secure = true;
      }
      goto LAB_0046dcef;
    }
LAB_0046db41:
    iVar4 = Curl_raw_equal("path",name);
    if (iVar4 != 0) {
      if (pCVar7->path != (char *)0x0) {
        (*Curl_cfree)(pCVar7->path);
      }
      pcVar19 = (*Curl_cstrdup)(pcVar19);
      pCVar7->path = pcVar19;
      bVar2 = true;
      if (pcVar19 == (char *)0x0) goto LAB_0046de28;
      pcVar19 = sanitize_cookie_path(pcVar19);
      pCVar7->spath = pcVar19;
joined_r0x0046db98:
      bVar2 = true;
      if (pcVar19 == (char *)0x0) goto LAB_0046de28;
      goto LAB_0046dcef;
    }
    iVar4 = Curl_raw_equal("domain",name);
    if (iVar4 == 0) {
      iVar4 = Curl_raw_equal("version",name);
      if (iVar4 == 0) {
        iVar4 = Curl_raw_equal("max-age",name);
        if (iVar4 != 0) {
          if (pCVar7->maxage != (char *)0x0) {
            (*Curl_cfree)(pCVar7->maxage);
          }
          pcVar19 = (*Curl_cstrdup)(pcVar19);
          pCVar7->maxage = pcVar19;
          if (pcVar19 != (char *)0x0) goto LAB_0046dcef;
          bVar2 = true;
          goto LAB_0046e43d;
        }
        iVar4 = Curl_raw_equal("expires",name);
        if (iVar4 == 0) {
          if (pCVar7->name != (char *)0x0) goto LAB_0046dcef;
          pcVar12 = (*Curl_cstrdup)(name);
          pCVar7->name = pcVar12;
          pcVar19 = (*Curl_cstrdup)(pcVar19);
          pCVar7->value = pcVar19;
          if (pCVar7->name != (char *)0x0) goto joined_r0x0046db98;
          goto LAB_0046e431;
        }
        if (pCVar7->expirestr != (char *)0x0) {
          (*Curl_cfree)(pCVar7->expirestr);
        }
        pcVar19 = (*Curl_cstrdup)(pcVar19);
        pCVar7->expirestr = pcVar19;
      }
      else {
        if (pCVar7->version != (char *)0x0) {
          (*Curl_cfree)(pCVar7->version);
        }
        pcVar19 = (*Curl_cstrdup)(pcVar19);
        pCVar7->version = pcVar19;
      }
      if (pcVar19 == (char *)0x0) {
        bVar2 = true;
        goto LAB_0046de28;
      }
      goto LAB_0046dcef;
    }
    pcVar19 = pcVar19 + (*pcVar19 == '.');
    pcVar12 = local_470;
    if (local_470 == (char *)0x0) {
      pcVar12 = pcVar19;
    }
    iVar4 = inet_pton(2,pcVar12,&addr);
    pcVar12 = strchr(pcVar19,0x2e);
    if (pcVar12 == (char *)0x0) {
      local_470 = ":";
    }
    if (local_470 != (char *)0x0) {
      if (iVar4 == 0) {
        _Var3 = tailmatch(pcVar19,local_470);
        if (!_Var3) goto LAB_0046dc27;
      }
      else {
        iVar5 = strcmp(pcVar19,local_470);
        if (iVar5 != 0) {
LAB_0046dc27:
          Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcVar19);
          bVar20 = true;
          goto LAB_0046dcef;
        }
      }
    }
    if (pCVar7->domain != (char *)0x0) {
      (*Curl_cfree)(pCVar7->domain);
    }
    pcVar19 = (*Curl_cstrdup)(pcVar19);
    pCVar7->domain = pcVar19;
    if ((pcVar19 != (char *)0x0) && (iVar4 == 0)) {
      pCVar7->tailmatch = true;
      goto LAB_0046dcef;
    }
    if (pcVar19 != (char *)0x0) goto LAB_0046dcef;
LAB_0046e431:
    bVar2 = true;
LAB_0046de28:
    pcVar9 = pCVar7->maxage;
    if (pcVar9 == (char *)0x0) {
LAB_0046e43d:
      if (pCVar7->expirestr != (char *)0x0) {
        tVar14 = curl_getdate(pCVar7->expirestr,(time_t *)0x0);
        pCVar7->expires = tVar14;
        if (tVar14 == 0) {
          pCVar7->expires = 1;
        }
        else if (tVar14 < 0) {
          pCVar7->expires = 0;
        }
      }
    }
    else {
      lVar13 = strtol(pcVar9 + (*pcVar9 == '\"'),(char **)0x0,10);
      pCVar7->expires = lVar13;
      if (0x7fffffffffffffff - tVar6 < lVar13) {
        pCVar7->expires = 0x7fffffffffffffff;
      }
      else {
        pCVar7->expires = lVar13 + tVar6;
      }
    }
    bVar20 = bVar2;
    if (((!bVar2) && (pCVar7->domain == (char *)0x0)) && (local_470 != (char *)0x0)) {
      pcVar9 = (*Curl_cstrdup)(local_470);
      pCVar7->domain = pcVar9;
      bVar20 = true;
      if (pcVar9 != (char *)0x0) {
        bVar20 = bVar2;
      }
    }
    if (((!bVar20) && (path != (char *)0x0)) && (pCVar7->path == (char *)0x0)) {
      pcVar9 = strchr(path,0x3f);
      if (pcVar9 == (char *)0x0) {
        pcVar9 = strrchr(path,0x2f);
      }
      else {
        pcVar9 = (char *)Curl_memrchr(path,0x2f,(long)pcVar9 - (long)path);
      }
      if (pcVar9 != (char *)0x0) {
        pcVar19 = (char *)(*Curl_cmalloc)((size_t)(pcVar9 + (2 - (long)path)));
        pCVar7->path = pcVar19;
        if (pcVar19 == (char *)0x0) {
          (*Curl_cfree)(pcVar8);
          goto LAB_0046e407;
        }
        memcpy(pcVar19,path,(size_t)(pcVar9 + (1 - (long)path)));
        pCVar7->path[(long)(pcVar9 + (1 - (long)path))] = '\0';
        pcVar9 = sanitize_cookie_path(pCVar7->path);
        pCVar7->spath = pcVar9;
        bVar20 = pcVar9 == (char *)0x0;
      }
    }
    (*Curl_cfree)(pcVar8);
    if ((bVar20) || (pCVar7->name == (char *)0x0)) goto LAB_0046e407;
  }
  else {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    iVar4 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar4 == 0) {
      lineptr = lineptr + 10;
      pCVar7->httponly = true;
    }
    if (*lineptr == '#') goto LAB_0046da31;
    pcVar8 = strchr(lineptr,0xd);
    if (pcVar8 != (char *)0x0) {
      *pcVar8 = '\0';
    }
    pcVar8 = strchr(lineptr,10);
    if (pcVar8 != (char *)0x0) {
      *pcVar8 = '\0';
    }
    pcVar8 = strtok_r(lineptr,"\t",(char **)name);
    if (pcVar8 == (char *)0x0) goto LAB_0046e407;
    uVar18 = 0;
    bVar2 = false;
    bVar20 = false;
    do {
      switch(uVar18) {
      case 0:
        pcVar8 = (*Curl_cstrdup)(pcVar8 + (*pcVar8 == '.'));
        pCVar7->domain = pcVar8;
        if (pcVar8 == (char *)0x0) {
          bVar2 = true;
        }
        uVar18 = 0;
        bVar20 = bVar2;
        break;
      case 1:
        iVar4 = Curl_raw_equal(pcVar8,"TRUE");
        pCVar7->tailmatch = iVar4 != 0;
        uVar18 = 1;
        break;
      case 2:
        iVar4 = strcmp("TRUE",pcVar8);
        if ((iVar4 == 0) || (iVar4 = strcmp("FALSE",pcVar8), iVar4 == 0)) {
          pcVar9 = (*Curl_cstrdup)("/");
          pCVar7->path = pcVar9;
          pcVar19 = (*Curl_cstrdup)("/");
          if (pcVar9 == (char *)0x0) {
            bVar2 = true;
          }
          pCVar7->spath = pcVar19;
          bVar20 = bVar2;
          if (pcVar19 == (char *)0x0) {
            bVar2 = true;
            bVar20 = true;
          }
          goto switchD_0046def4_caseD_3;
        }
        pcVar8 = (*Curl_cstrdup)(pcVar8);
        pCVar7->path = pcVar8;
        uVar18 = 2;
        if (pcVar8 == (char *)0x0) {
          bVar20 = true;
          bVar2 = true;
        }
        else {
          pcVar8 = sanitize_cookie_path(pcVar8);
          pCVar7->spath = pcVar8;
          bVar20 = bVar2;
          if (pcVar8 == (char *)0x0) {
            bVar20 = true;
            bVar2 = bVar20;
          }
        }
        break;
      case 3:
switchD_0046def4_caseD_3:
        iVar4 = Curl_raw_equal(pcVar8,"TRUE");
        pCVar7->secure = iVar4 != 0;
        uVar18 = 3;
        break;
      case 4:
        lVar13 = strtol(pcVar8,(char **)0x0,10);
        pCVar7->expires = lVar13;
        uVar18 = 4;
        break;
      case 5:
        pcVar8 = (*Curl_cstrdup)(pcVar8);
        pCVar7->name = pcVar8;
        if (pcVar8 == (char *)0x0) {
          bVar2 = true;
        }
        uVar18 = 5;
        bVar20 = bVar2;
        break;
      case 6:
        pcVar8 = (*Curl_cstrdup)(pcVar8);
        pCVar7->value = pcVar8;
        if (pcVar8 == (char *)0x0) {
          bVar2 = true;
        }
        uVar18 = 6;
        bVar20 = bVar2;
      }
      pcVar8 = strtok_r((char *)0x0,"\t",(char **)name);
      uVar18 = uVar18 + 1;
    } while ((pcVar8 != (char *)0x0) && (!bVar20));
    if (uVar18 == 6) {
      pcVar8 = (*Curl_cstrdup)("");
      pCVar7->value = pcVar8;
      bVar2 = true;
      if (pcVar8 != (char *)0x0) {
        bVar2 = bVar20;
      }
      bVar20 = bVar2;
      uVar18 = pcVar8 == (char *)0x0 ^ 7;
    }
    if ((bVar20) || (uVar18 != 7)) goto LAB_0046e407;
  }
  if ((c->running != false) || ((c->newsession != true || (pCVar7->expires != 0)))) {
    pCVar7->livecookie = c->running;
    remove_expired(c);
    if (c->cookies == (Cookie *)0x0) {
      bVar20 = false;
      pCVar17 = (Cookie *)0x0;
    }
    else {
      bVar20 = false;
      pCVar15 = c->cookies;
      do {
        pCVar17 = pCVar15;
        iVar4 = Curl_raw_equal(pCVar17->name,pCVar7->name);
        if (iVar4 != 0) {
          pcVar8 = pCVar7->domain;
          if (pCVar17->domain == (char *)0x0) {
            if (pcVar8 == (char *)0x0) {
              bVar20 = true;
            }
          }
          else if ((pcVar8 != (char *)0x0) &&
                  (iVar4 = Curl_raw_equal(pCVar17->domain,pcVar8), iVar4 != 0)) {
            bVar20 = true;
          }
          if (bVar20) {
            pcVar8 = pCVar7->spath;
            if (pCVar17->spath == (char *)0x0) {
              if (pcVar8 != (char *)0x0) {
LAB_0046e21b:
                bVar20 = false;
                goto LAB_0046e21e;
              }
            }
            else if ((pcVar8 == (char *)0x0) ||
                    (iVar4 = Curl_raw_equal(pCVar17->spath,pcVar8), iVar4 == 0)) goto LAB_0046e21b;
            if ((pCVar7->livecookie != false) || (pCVar17->livecookie != true)) {
              pCVar7->next = pCVar17->next;
              (*Curl_cfree)(pCVar17->name);
              if (pCVar17->value != (char *)0x0) {
                (*Curl_cfree)(pCVar17->value);
              }
              if (pCVar17->domain != (char *)0x0) {
                (*Curl_cfree)(pCVar17->domain);
              }
              if (pCVar17->path != (char *)0x0) {
                (*Curl_cfree)(pCVar17->path);
              }
              if (pCVar17->spath != (char *)0x0) {
                (*Curl_cfree)(pCVar17->spath);
              }
              if (pCVar17->expirestr != (char *)0x0) {
                (*Curl_cfree)(pCVar17->expirestr);
              }
              if (pCVar17->version != (char *)0x0) {
                (*Curl_cfree)(pCVar17->version);
              }
              if (pCVar17->maxage != (char *)0x0) {
                (*Curl_cfree)(pCVar17->maxage);
              }
              pCVar15 = pCVar7;
              pCVar16 = pCVar17;
              for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
                pCVar16->next = pCVar15->next;
                pCVar15 = (Cookie *)((long)pCVar15 + (ulong)bVar21 * -0x10 + 8);
                pCVar16 = (Cookie *)((long)pCVar16 + (ulong)bVar21 * -0x10 + 8);
              }
              (*Curl_cfree)(pCVar7);
              pCVar7 = pCVar17;
              do {
                pCVar15 = pCVar7;
                pCVar7 = pCVar15->next;
              } while (pCVar7 != (Cookie *)0x0);
              bVar20 = true;
              pCVar7 = pCVar17;
              pCVar17 = pCVar15;
              break;
            }
            goto LAB_0046e407;
          }
        }
LAB_0046e21e:
        pCVar15 = pCVar17->next;
      } while (pCVar17->next != (Cookie *)0x0);
    }
    if (c->running != false) {
      pcVar8 = "Added";
      if (bVar20) {
        pcVar8 = "Replaced";
      }
      Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar8,pCVar7->name
                 ,pCVar7->value,pCVar7->domain,pCVar7->path,pCVar7->expires);
    }
    if (!bVar20) {
      if (pCVar17 == (Cookie *)0x0) {
        pCVar17 = (Cookie *)c;
      }
      pCVar17->next = pCVar7;
      c->numcookies = c->numcookies + 1;
      return pCVar7;
    }
    return pCVar7;
  }
LAB_0046e407:
  freecookie(pCVar7);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct SessionHandle *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path)   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
{
  struct Cookie *clist;
  char name[MAX_NAME];
  struct Cookie *co;
  struct Cookie *lastc=NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    const char *ptr;
    const char *semiptr;
    char *what;

    what = malloc(MAX_COOKIE_LINE);
    if(!what) {
      free(co);
      return NULL;
    }

    semiptr=strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0]=what[0]=0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n =]=%"
                     MAX_COOKIE_LINE_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len=strlen(what);
        const char *endofn = &ptr[ strlen(name) ];

        /* skip trailing spaces in name */
        while(*endofn && ISBLANK(*endofn))
          endofn++;

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1]=0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr=what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          if(Curl_raw_equal("secure", name))
            co->secure = TRUE;
          else if(Curl_raw_equal("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(Curl_raw_equal("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(Curl_raw_equal("domain", name)) {
          bool is_ip;
          const char *dotp;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

          is_ip = isip(domain ? domain : whatptr);

          /* check for more dots */
          dotp = strchr(whatptr, '.');
          if(!dotp)
            domain=":";

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch=TRUE; /* we always do that if the domain name was
                                     given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie=TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(Curl_raw_equal("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(Curl_raw_equal("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(Curl_raw_equal("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!co->name) {
          co->name = strdup(name);
          co->value = strdup(whatptr);
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr=semiptr+1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr=strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr=strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      co->expires =
        curlx_strtoofft((*co->maxage=='\"')?
                        &co->maxage[1]:&co->maxage[0], NULL, 10);
      if(CURL_OFF_T_MAX - now < co->expires)
        /* avoid overflow */
        co->expires = CURL_OFF_T_MAX;
      else
        co->expires += now;
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain=strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (size_t)(queryp - path));
      if(endslash) {
        size_t pathlen = (size_t)(endslash-path+1); /* include ending slash */
        co->path=malloc(pathlen+1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen]=0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    free(what);

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf=NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr=strchr(lineptr, '\r');
    if(ptr)
      *ptr=0; /* clear it */
    ptr=strchr(lineptr, '\n');
    if(ptr)
      *ptr=0; /* clear it */

    firstptr=strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr=firstptr, fields=0; ptr && !badcookie;
        ptr=strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andr�s Garc�a:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = Curl_raw_equal(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andr�s Garc�a made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = Curl_raw_equal(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 4:
        co->expires = curlx_strtoofft(ptr, NULL, 10);
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;

  /* now, we have parsed the incoming line, we must now check if this
     superceeds an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  remove_expired(c);

  clist = c->cookies;
  replace_old = FALSE;
  while(clist) {
    if(Curl_raw_equal(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(Curl_raw_equal(clist->domain, co->domain))
          /* The domains are identical */
          replace_old=TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(Curl_raw_equal(clist->spath, co->spath)) {
            replace_old = TRUE;
          }
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* then free all the old pointers */
        free(clist->name);
        if(clist->value)
          free(clist->value);
        if(clist->domain)
          free(clist->domain);
        if(clist->path)
          free(clist->path);
        if(clist->spath)
          free(clist->spath);
        if(clist->expirestr)
          free(clist->expirestr);

        if(clist->version)
          free(clist->version);
        if(clist->maxage)
          free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}